

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeViewPrivate::coordinateForItem(QTreeViewPrivate *this,int item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int viewItemCoordinate;
  ulong uVar4;
  long lVar5;
  
  if ((this->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerPixel) {
    if (this->uniformRowHeights == false) {
      iVar1 = 0;
      iVar3 = 0;
      for (uVar4 = 0; uVar4 < (ulong)(this->viewItems).d.size; uVar4 = uVar4 + 1) {
        if ((uint)item == uVar4) goto LAB_00540a6e;
        iVar2 = itemHeight(this,(int)uVar4);
        iVar3 = iVar3 + iVar2;
      }
    }
    else {
      iVar3 = item * this->defaultItemHeight;
LAB_00540a6e:
      iVar1 = QAbstractSlider::value
                        (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                          vbar)->super_QAbstractSlider);
      iVar1 = iVar3 - iVar1;
    }
  }
  else {
    iVar3 = QAbstractSlider::value
                      (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        vbar)->super_QAbstractSlider);
    if (this->uniformRowHeights == true) {
      iVar1 = (item - iVar3) * this->defaultItemHeight;
    }
    else if (item < iVar3) {
      iVar1 = 0;
      while ((0 < iVar3 && (item != iVar3))) {
        iVar3 = iVar3 + -1;
        iVar2 = itemHeight(this,iVar3);
        iVar1 = iVar1 - iVar2;
      }
    }
    else {
      iVar1 = 0;
      for (lVar5 = (long)iVar3; (item != lVar5 && (lVar5 < (this->viewItems).d.size));
          lVar5 = lVar5 + 1) {
        iVar3 = itemHeight(this,(int)lVar5);
        iVar1 = iVar1 + iVar3;
      }
    }
  }
  return iVar1;
}

Assistant:

int QTreeViewPrivate::coordinateForItem(int item) const
{
    if (verticalScrollMode == QAbstractItemView::ScrollPerPixel) {
        if (uniformRowHeights)
            return (item * defaultItemHeight) - vbar->value();
        // ### optimize (maybe do like QHeaderView by letting items have startposition)
        int y = 0;
        for (int i = 0; i < viewItems.size(); ++i) {
            if (i == item)
                return y - vbar->value();
            y += itemHeight(i);
        }
    } else { // ScrollPerItem
        int topViewItemIndex = vbar->value();
        if (uniformRowHeights)
            return defaultItemHeight * (item - topViewItemIndex);
        if (item >= topViewItemIndex) {
            // search in the visible area first and continue down
            // ### slow if the item is not visible
            int viewItemCoordinate = 0;
            int viewItemIndex = topViewItemIndex;
            while (viewItemIndex < viewItems.size()) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate += itemHeight(viewItemIndex);
                ++viewItemIndex;
            }
            // below the last item in the view
            Q_ASSERT(false);
            return viewItemCoordinate;
        } else {
            // search the area above the viewport (used for editor widgets)
            int viewItemCoordinate = 0;
            for (int viewItemIndex = topViewItemIndex; viewItemIndex > 0; --viewItemIndex) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate -= itemHeight(viewItemIndex - 1);
            }
            return viewItemCoordinate;
        }
    }
    return 0;
}